

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_worker.c
# Opt level: O0

apx_error_t
apx_fileManagerWorker_prepare_send_local_const_data
          (apx_fileManagerWorker_t *self,uint32_t address,uint8_t *data,uint32_t size)

{
  undefined1 local_50 [8];
  apx_command_t cmd;
  adt_buf_err_t rc;
  uint32_t size_local;
  uint8_t *data_local;
  uint32_t address_local;
  apx_fileManagerWorker_t *self_local;
  
  if (self == (apx_fileManagerWorker_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    cmd.data4._4_4_ = size;
    apx_build_command_with_ptr((apx_command_t *)local_50,'\a',address,size,data,(void *)0x0);
    pthread_spin_lock(&self->queue_lock);
    cmd.data4._3_1_ = adt_rbfh_insert(&self->queue,local_50);
    pthread_spin_unlock(&self->queue_lock);
    sem_post((sem_t *)&self->semaphore);
    self_local._4_4_ = apx_fileManagerWorker_process_ringbuffer_error(cmd.data4._3_1_);
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_fileManagerWorker_prepare_send_local_const_data(apx_fileManagerWorker_t* self, uint32_t address, uint8_t const* data, uint32_t size)
{
   if (self != NULL)
   {
      adt_buf_err_t rc;
      apx_command_t cmd;
      apx_build_command_with_ptr(&cmd, APX_CMD_SEND_LOCAL_CONST_DATA, address, size, (void*) data, NULL);
      SPINLOCK_ENTER(self->queue_lock);
      rc = adt_rbfh_insert(&self->queue, (const uint8_t*)&cmd);
      SPINLOCK_LEAVE(self->queue_lock);
#ifndef UNIT_TEST
      SEMAPHORE_POST(self->semaphore);
#endif
      return apx_fileManagerWorker_process_ringbuffer_error(rc);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}